

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

int raviX_ptrlist_replace(PtrList **self,void *old_ptr,void *new_ptr,int count)

{
  void *pvVar1;
  bool bVar2;
  PtrListIterator iter;
  PtrListIterator local_40;
  
  local_40.__head = *self;
  local_40.__nr = -1;
  local_40.__list = local_40.__head;
  pvVar1 = raviX_ptrlist_iter_next(&local_40);
  bVar2 = pvVar1 != (void *)0x0;
  if (bVar2) {
    do {
      if (pvVar1 == old_ptr) {
        raviX_ptrlist_iter_set(&local_40,new_ptr);
        count = count + -1;
        if (count == 0) {
          count = 0;
          break;
        }
      }
      pvVar1 = raviX_ptrlist_iter_next(&local_40);
      bVar2 = pvVar1 != (void *)0x0;
    } while (bVar2);
  }
  if (!(bool)(count < 1 | bVar2)) {
    __assert_fail("count <= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                  ,0x152,"int raviX_ptrlist_replace(PtrList **, void *, void *, int)");
  }
  return count;
}

Assistant:

int raviX_ptrlist_replace(PtrList **self, void *old_ptr, void *new_ptr, int count)
{
	PtrListIterator iter = raviX_ptrlist_forward_iterator(*self);
	for (void *ptr = raviX_ptrlist_iter_next(&iter); ptr != NULL; ptr = raviX_ptrlist_iter_next(&iter)) {
		if (ptr == old_ptr) {
			raviX_ptrlist_iter_set(&iter, new_ptr);
			if (!--count)
				goto out;
		}
	}
	assert(count <= 0);
out:
	return count;
}